

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O0

PacketBuilder * __thiscall PacketBuilder::AddByte(PacketBuilder *this,uchar byte)

{
  uchar byte_local;
  PacketBuilder *this_local;
  
  std::__cxx11::string::operator+=((string *)&this->data,byte);
  return this;
}

Assistant:

PacketBuilder &PacketBuilder::AddByte(unsigned char byte)
{
#ifdef DEBUG
	std::size_t capacity_before = this->Capacity();
#endif

	this->data += static_cast<char>(byte);

#ifdef DEBUG
	if (this->data.length() > capacity_before)
		debug_packetbuilder_overflow(this, capacity_before);
#endif

	return *this;
}